

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniformField.cpp
# Opt level: O0

void __thiscall OpenMD::UniformField::initialize(UniformField *this)

{
  value_type vVar1;
  bool bVar2;
  uint uVar3;
  size_type sVar4;
  reference pvVar5;
  double *pdVar6;
  SnapshotManager *this_00;
  long in_RDI;
  int storageLayout_;
  vector<double,_std::allocator<double>_> ef;
  Globals *in_stack_ffffffffffffff38;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff48;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff50;
  vector<double,_std::allocator<double>_> *this_01;
  vector<double,_std::allocator<double>_> local_20;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x370cf9);
  bVar2 = Globals::haveElectricField((Globals *)0x370d07);
  if (bVar2) {
    *(undefined1 *)(in_RDI + 0x11) = 1;
    Globals::getElectricField(in_stack_ffffffffffffff38);
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff50);
  }
  bVar2 = Globals::haveUniformField((Globals *)0x370d8b);
  if (bVar2) {
    *(undefined1 *)(in_RDI + 0x11) = 1;
    Globals::getUniformField(in_stack_ffffffffffffff38);
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff50);
  }
  sVar4 = std::vector<double,_std::allocator<double>_>::size(&local_20);
  if (sVar4 != 3) {
    sVar4 = std::vector<double,_std::allocator<double>_>::size(&local_20);
    snprintf(painCave.errMsg,2000,
             "UniformField: Incorrect number of parameters specified.\n\tthere should be 3 parameters, but %zu were specified.\n"
             ,sVar4);
    painCave.isFatal = 1;
    simError();
  }
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_20,0);
  vVar1 = *pvVar5;
  pdVar6 = Vector3<double>::x((Vector3<double> *)(in_RDI + 0x20));
  *pdVar6 = vVar1;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_20,1);
  vVar1 = *pvVar5;
  pdVar6 = Vector3<double>::y((Vector3<double> *)(in_RDI + 0x20));
  *pdVar6 = vVar1;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_20,2);
  this_01 = (vector<double,_std::allocator<double>_> *)*pvVar5;
  pdVar6 = Vector3<double>::z((Vector3<double> *)(in_RDI + 0x20));
  *pdVar6 = (double)this_01;
  this_00 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 8));
  uVar3 = SnapshotManager::getAtomStorageLayout(this_00);
  if ((uVar3 & 0x40) != 0) {
    *(undefined1 *)(in_RDI + 0x12) = 1;
  }
  *(undefined1 *)(in_RDI + 0x10) = 1;
  std::vector<double,_std::allocator<double>_>::~vector(this_01);
  return;
}

Assistant:

void UniformField::initialize() {
    std::vector<RealType> ef;

    if (simParams->haveElectricField()) {
      doUniformField = true;
      ef             = simParams->getElectricField();
    }
    if (simParams->haveUniformField()) {
      doUniformField = true;
      ef             = simParams->getUniformField();
    }
    if (ef.size() != 3) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "UniformField: Incorrect number of parameters specified.\n"
               "\tthere should be 3 parameters, but %zu were specified.\n",
               ef.size());
      painCave.isFatal = 1;
      simError();
    }
    EF.x() = ef[0];
    EF.y() = ef[1];
    EF.z() = ef[2];

    int storageLayout_ = info_->getSnapshotManager()->getAtomStorageLayout();
    if (storageLayout_ & DataStorage::dslParticlePot) doParticlePot = true;
    initialized = true;
  }